

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O3

void __thiscall FGameConfigFile::DoKeySetup(FGameConfigFile *this,char *gamename)

{
  FKeyBindings *this_00;
  bool bVar1;
  int iVar2;
  int i;
  long lVar3;
  char *__src;
  anon_struct_16_2_21352551 *paVar4;
  char *value;
  char *key;
  char *local_40;
  char *local_38;
  
  lVar3 = 0;
  iVar2 = mysnprintf(this->section,0x40,"%s.",gamename);
  this->sublen = 0x3f - (long)iVar2;
  this->subsection = this->section + iVar2;
  this->section[0x3f] = '\0';
  C_SetDefaultBindings();
  __src = "Bindings";
  paVar4 = DoKeySetup::binders;
  do {
    strncpy(this->subsection,__src,this->sublen);
    bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,this->section,false);
    if (bVar1) {
      this_00 = paVar4->bindings;
      FKeyBindings::UnbindAll(this_00);
      while( true ) {
        bVar1 = FConfigFile::NextInSection(&this->super_FConfigFile,&local_38,&local_40);
        if (!bVar1) break;
        FKeyBindings::DoBind(this_00,local_38,local_40);
      }
    }
    lVar3 = lVar3 + 1;
    paVar4 = DoKeySetup::binders + lVar3;
    __src = DoKeySetup::binders[lVar3].label;
  } while (lVar3 != 3);
  return;
}

Assistant:

void FGameConfigFile::DoKeySetup(const char *gamename)
{
	static const struct { const char *label; FKeyBindings *bindings; } binders[] =
	{
		{ "Bindings", &Bindings },
		{ "DoubleBindings", &DoubleBindings },
		{ "AutomapBindings", &AutomapBindings },
		{ NULL, NULL }
	};
	const char *key, *value;

	sublen = countof(section) - 1 - mysnprintf(section, countof(section), "%s.", gamename);
	subsection = section + countof(section) - sublen - 1;
	section[countof(section) - 1] = '\0';

	C_SetDefaultBindings ();

	for (int i = 0; binders[i].label != NULL; ++i)
	{
		strncpy(subsection, binders[i].label, sublen);
		if (SetSection(section))
		{
			FKeyBindings *bindings = binders[i].bindings;
			bindings->UnbindAll();
			while (NextInSection(key, value))
			{
				bindings->DoBind(key, value);
			}
		}
	}
}